

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O0

void __thiscall
lunasvg::Canvas::fillPath(Canvas *this,Path *path,FillRule fillRule,Transform *transform)

{
  plutovg_canvas_t *ppVar1;
  plutovg_matrix_t *matrix;
  plutovg_path_t *path_00;
  Transform *transform_local;
  FillRule fillRule_local;
  Path *path_local;
  Canvas *this_local;
  
  plutovg_canvas_reset_matrix(this->m_canvas);
  plutovg_canvas_translate(this->m_canvas,(float)-this->m_x,(float)-this->m_y);
  ppVar1 = this->m_canvas;
  matrix = Transform::matrix(transform);
  plutovg_canvas_transform(ppVar1,matrix);
  plutovg_canvas_set_fill_rule(this->m_canvas,(uint)fillRule);
  plutovg_canvas_set_operator(this->m_canvas,PLUTOVG_OPERATOR_SRC_OVER);
  ppVar1 = this->m_canvas;
  path_00 = Path::data(path);
  plutovg_canvas_fill_path(ppVar1,path_00);
  return;
}

Assistant:

void Canvas::fillPath(const Path& path, FillRule fillRule, const Transform& transform)
{
    plutovg_canvas_reset_matrix(m_canvas);
    plutovg_canvas_translate(m_canvas, -m_x, -m_y);
    plutovg_canvas_transform(m_canvas, &transform.matrix());
    plutovg_canvas_set_fill_rule(m_canvas, static_cast<plutovg_fill_rule_t>(fillRule));
    plutovg_canvas_set_operator(m_canvas, PLUTOVG_OPERATOR_SRC_OVER);
    plutovg_canvas_fill_path(m_canvas, path.data());
}